

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
 wabt::MakeUnique<wabt::DataScriptModule<(wabt::ScriptModuleType)2>>(void)

{
  undefined8 *puVar1;
  __uniq_ptr_data<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>,_true,_true>
  in_RDI;
  
  puVar1 = (undefined8 *)operator_new(0x68);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  *(undefined4 *)(puVar1 + 1) = 2;
  *puVar1 = &PTR__DataScriptModule_001dd880;
  *(undefined8 *)((long)puVar1 + 0x1c) = 0;
  *(undefined8 *)((long)puVar1 + 0x24) = 0;
  puVar1[6] = puVar1 + 8;
  *(undefined1 *)(puVar1 + 8) = 0;
  puVar1[0xc] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  *(undefined8 **)
   in_RDI.
   super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)2>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
   .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)2>_*,_false>._M_head_impl =
       puVar1;
  return (__uniq_ptr_data<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>,_true,_true>
          )(tuple<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
            )in_RDI.
             super___uniq_ptr_impl<wabt::DataScriptModule<(wabt::ScriptModuleType)2>,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)2>_*,_std::default_delete<wabt::DataScriptModule<(wabt::ScriptModuleType)2>_>_>
             .super__Head_base<0UL,_wabt::DataScriptModule<(wabt::ScriptModuleType)2>_*,_false>.
             _M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}